

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QPointF __thiscall QWidgetTextControl::anchorPosition(QWidgetTextControl *this,QString *name)

{
  QPointF QVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  qreal ypos;
  QWidgetTextControlPrivate *d;
  QTextFragment fragment;
  QRectF r;
  Iterator it;
  QTextCharFormat format;
  QTextBlock block;
  undefined4 in_stack_fffffffffffffe88;
  CaseSensitivity in_stack_fffffffffffffe8c;
  QString *in_stack_fffffffffffffe90;
  QListSpecialMethods<QString> *in_stack_fffffffffffffe98;
  bool local_151;
  bool local_142;
  qreal local_120;
  qreal local_118;
  qreal local_110;
  qreal local_108;
  int in_stack_ffffffffffffff14;
  QWidgetTextControlPrivate *in_stack_ffffffffffffff18;
  qreal local_d8;
  qreal local_d0;
  qreal local_c8;
  qreal local_c0;
  QRectF local_a0;
  QPointF local_80;
  QTextBlock local_70;
  QTextBlock local_60 [2];
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidgetTextControl *)0x71fee0);
  bVar2 = QString::isEmpty((QString *)0x71feef);
  if (bVar2) {
    QPointF::QPointF(&local_80);
  }
  else {
    local_a0.xp = -NAN;
    local_a0.yp = -NAN;
    local_a0.w = -NAN;
    local_a0.h = -NAN;
    QRectF::QRectF(&local_a0);
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::begin();
    while (uVar3 = QTextBlock::isValid(), (uVar3 & 1) != 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::charFormat();
      bVar2 = QTextCharFormat::isAnchor((QTextCharFormat *)0x71ffda);
      local_142 = false;
      if (bVar2) {
        QTextCharFormat::anchorNames();
        local_142 = QListSpecialMethods<QString>::contains
                              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                               in_stack_fffffffffffffe8c);
        QList<QString>::~QList((QList<QString> *)0x720041);
      }
      if (local_142 == false) {
        local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::begin();
        while (bVar2 = QTextBlock::iterator::atEnd((iterator *)local_40), ((bVar2 ^ 0xffU) & 1) != 0
              ) {
          in_stack_ffffffffffffff18 = (QWidgetTextControlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          QTextFragment::charFormat();
          QTextCharFormat::operator=
                    ((QTextCharFormat *)in_stack_fffffffffffffe90,
                     (QTextCharFormat *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x720187);
          bVar2 = QTextCharFormat::isAnchor((QTextCharFormat *)0x720194);
          local_151 = false;
          if (bVar2) {
            QTextCharFormat::anchorNames();
            local_151 = QListSpecialMethods<QString>::contains
                                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                   in_stack_fffffffffffffe8c);
            QList<QString>::~QList((QList<QString> *)0x7201f2);
          }
          if (local_151 != false) {
            QTextFragment::position();
            QWidgetTextControlPrivate::rectForPosition
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
            local_a0.xp = local_120;
            local_a0.yp = local_118;
            local_a0.w = local_110;
            local_a0.h = local_108;
            QTextBlock::QTextBlock(local_60);
            QTextBlock::operator=((QTextBlock *)local_18,local_60);
            break;
          }
          QTextBlock::iterator::operator++((iterator *)local_40);
        }
        bVar2 = false;
      }
      else {
        QTextBlock::position();
        QWidgetTextControlPrivate::rectForPosition
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
        local_a0.xp = local_d8;
        local_a0.yp = local_d0;
        local_a0.w = local_c8;
        local_a0.h = local_c0;
        bVar2 = true;
      }
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7202a8);
      if (bVar2) break;
      QTextBlock::next();
      QTextBlock::operator=((QTextBlock *)local_18,&local_70);
    }
    bVar2 = QRectF::isValid(&local_a0);
    if (bVar2) {
      ypos = QRectF::top(&local_a0);
      QPointF::QPointF(&local_80,0.0,ypos);
    }
    else {
      QPointF::QPointF(&local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.yp = local_80.yp;
  QVar1.xp = local_80.xp;
  return QVar1;
}

Assistant:

QPointF QWidgetTextControl::anchorPosition(const QString &name) const
{
    Q_D(const QWidgetTextControl);
    if (name.isEmpty())
        return QPointF();

    QRectF r;
    for (QTextBlock block = d->doc->begin(); block.isValid(); block = block.next()) {
        QTextCharFormat format = block.charFormat();
        if (format.isAnchor() && format.anchorNames().contains(name)) {
            r = d->rectForPosition(block.position());
            break;
        }

        for (QTextBlock::Iterator it = block.begin(); !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            format = fragment.charFormat();
            if (format.isAnchor() && format.anchorNames().contains(name)) {
                r = d->rectForPosition(fragment.position());
                block = QTextBlock();
                break;
            }
        }
    }
    if (!r.isValid())
        return QPointF();
    return QPointF(0, r.top());
}